

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bandpre.c
# Opt level: O0

int ARKBandPrecInit(void *arkode_mem,sunindextype N,sunindextype mu,sunindextype ml)

{
  int iVar1;
  long *__ptr;
  long mu_00;
  SUNMatrix A;
  SUNMatrix p_Var2;
  N_Vector *v;
  SUNLinearSolver p_Var3;
  ARKodeMem in_RCX;
  SUNContext_conflict in_RDX;
  long in_RSI;
  long in_RDI;
  int retval;
  sunindextype storagemu;
  sunindextype mlp;
  sunindextype mup;
  ARKBandPrecData pdata;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKodeMem in_stack_ffffffffffffff60;
  ARKodeMem *in_stack_ffffffffffffff68;
  ARKodeMem pAVar4;
  ARKodeMem ark_mem_00;
  char *in_stack_ffffffffffffff70;
  ARKodeMem sunctx;
  void *in_stack_ffffffffffffff78;
  SUNContext_conflict in_stack_ffffffffffffff80;
  SUNContext_conflict smu;
  SUNContext_conflict arkode_mem_00;
  SUNContext_conflict ml_00;
  undefined4 in_stack_ffffffffffffffa0;
  long local_38;
  ARKodeMem local_30;
  int local_4;
  
  local_4 = arkLs_AccessARKODELMem
                      (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
                       ,(ARKLsMem *)in_stack_ffffffffffffff60);
  if (local_4 == 0) {
    if (local_30->tempv1->ops->nvgetarraypointer == (_func_sunrealtype_ptr_N_Vector *)0x0) {
      arkProcessError(local_30,-3,0x48,"ARKBandPrecInit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                      ,"A required vector operation is not implemented.");
      local_4 = -3;
    }
    else {
      __ptr = (long *)malloc(0x50);
      if (__ptr == (long *)0x0) {
        arkProcessError(local_30,-4,0x52,"ARKBandPrecInit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                        ,"A memory request failed.");
        local_4 = -4;
      }
      else {
        __ptr[9] = in_RDI;
        *__ptr = in_RSI;
        mu_00 = in_RSI + -1;
        ml_00 = in_RDX;
        if ((long)in_RDX < 0) {
          ml_00 = (SUNContext_conflict)0x0;
        }
        if (mu_00 < (long)ml_00) {
          in_RDX = in_stack_ffffffffffffff80;
          smu = (SUNContext_conflict)(in_RSI + -1);
        }
        else {
          smu = in_RDX;
          if ((long)in_RDX < 0) {
            in_RDX = (SUNContext_conflict)0x0;
            smu = in_RDX;
          }
        }
        __ptr[2] = (long)smu;
        A = (SUNMatrix)(in_RSI + -1);
        sunctx = in_RCX;
        if ((long)in_RCX < 0) {
          sunctx = (ARKodeMem)0x0;
        }
        if ((long)A < (long)sunctx) {
          in_RCX = in_stack_ffffffffffffff60;
          pAVar4 = (ARKodeMem)(in_RSI + -1);
        }
        else {
          pAVar4 = in_RCX;
          if ((long)in_RCX < 0) {
            in_RCX = (ARKodeMem)0x0;
            pAVar4 = in_RCX;
          }
        }
        __ptr[1] = (long)pAVar4;
        __ptr[8] = 0;
        __ptr[3] = 0;
        ark_mem_00 = pAVar4;
        arkode_mem_00 = smu;
        p_Var2 = SUNBandMatrixStorage
                           (CONCAT44(local_4,in_stack_ffffffffffffffa0),mu_00,(sunindextype)ml_00,
                            (sunindextype)smu,in_RDX);
        __ptr[3] = (long)p_Var2;
        if (__ptr[3] == 0) {
          free(__ptr);
          arkProcessError(local_30,-4,0x67,"ARKBandPrecInit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                          ,"A memory request failed.");
          local_4 = -4;
        }
        else {
          if (in_RSI + -1 < (long)&pAVar4->sunctx + (long)&smu->profiler) {
            v = (N_Vector *)(in_RSI + -1);
          }
          else {
            v = (N_Vector *)((long)&pAVar4->sunctx + (long)&smu->profiler);
          }
          __ptr[4] = 0;
          p_Var2 = SUNBandMatrixStorage
                             (CONCAT44(local_4,in_stack_ffffffffffffffa0),mu_00,(sunindextype)ml_00,
                              (sunindextype)arkode_mem_00,in_RDX);
          __ptr[4] = (long)p_Var2;
          if (__ptr[4] == 0) {
            SUNMatDestroy(__ptr[3]);
            free(__ptr);
            arkProcessError(local_30,-4,0x75,"ARKBandPrecInit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                            ,"A memory request failed.");
            local_4 = -4;
          }
          else {
            __ptr[5] = 0;
            p_Var3 = SUNLinSol_Band((N_Vector)in_RDX,A,(SUNContext_conflict)sunctx);
            __ptr[5] = (long)p_Var3;
            if (__ptr[5] == 0) {
              SUNMatDestroy(__ptr[4]);
              SUNMatDestroy(__ptr[3]);
              free(__ptr);
              arkProcessError(local_30,-4,0x83,"ARKBandPrecInit",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                              ,"A memory request failed.");
              local_4 = -4;
            }
            else {
              __ptr[6] = 0;
              iVar1 = arkAllocVec(ark_mem_00,(N_Vector)in_RCX,v);
              if (iVar1 == 0) {
                SUNLinSolFree(__ptr[5]);
                SUNMatDestroy(__ptr[4]);
                SUNMatDestroy(__ptr[3]);
                free(__ptr);
                arkProcessError(local_30,-4,0x91,"ARKBandPrecInit",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                                ,"A memory request failed.");
                local_4 = -4;
              }
              else {
                __ptr[7] = 0;
                iVar1 = arkAllocVec(ark_mem_00,(N_Vector)in_RCX,v);
                if (iVar1 == 0) {
                  SUNLinSolFree(__ptr[5]);
                  SUNMatDestroy(__ptr[4]);
                  SUNMatDestroy(__ptr[3]);
                  arkFreeVec(in_RCX,v);
                  free(__ptr);
                  arkProcessError(local_30,-4,0x9f,"ARKBandPrecInit",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                                  ,"A memory request failed.");
                  local_4 = -4;
                }
                else {
                  iVar1 = SUNLinSolInitialize(__ptr[5]);
                  if (iVar1 == 0) {
                    if (*(long *)(local_38 + 0xe0) != 0) {
                      (**(code **)(local_38 + 0xe0))(local_30);
                    }
                    *(long **)(local_38 + 0xe8) = __ptr;
                    *(code **)(local_38 + 0xe0) = ARKBandPrecFree;
                    local_4 = ARKodeSetPreconditioner
                                        (arkode_mem_00,(ARKLsPrecSetupFn)in_RDX,(ARKLsPrecSolveFn)A)
                    ;
                  }
                  else {
                    SUNLinSolFree(__ptr[5]);
                    SUNMatDestroy(__ptr[4]);
                    SUNMatDestroy(__ptr[3]);
                    arkFreeVec(in_RCX,v);
                    arkFreeVec(in_RCX,v);
                    free(__ptr);
                    arkProcessError(local_30,-0xc,0xaf,"ARKBandPrecInit",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                                    ,"An error arose from a SUNBandLinearSolver routine.");
                    local_4 = -0xc;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int ARKBandPrecInit(void* arkode_mem, sunindextype N, sunindextype mu,
                    sunindextype ml)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKBandPrecData pdata;
  sunindextype mup, mlp, storagemu;
  int retval;

  /* access ARKodeMem and ARKLsMem structures */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Test compatibility of NVECTOR package with the BAND preconditioner */
  if (ark_mem->tempv1->ops->nvgetarraypointer == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BP_BAD_NVECTOR);
    return (ARKLS_ILL_INPUT);
  }

  /* Allocate data memory */
  pdata = NULL;
  pdata = (ARKBandPrecData)malloc(sizeof *pdata);
  if (pdata == NULL)
  {
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BP_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* Load pointers and bandwidths into pdata block. */
  pdata->arkode_mem = arkode_mem;
  pdata->N          = N;
  pdata->mu = mup = SUNMIN(N - 1, SUNMAX(0, mu));
  pdata->ml = mlp = SUNMIN(N - 1, SUNMAX(0, ml));

  /* Initialize nfeBP counter */
  pdata->nfeBP = 0;

  /* Allocate memory for saved banded Jacobian approximation. */
  pdata->savedJ = NULL;
  pdata->savedJ = SUNBandMatrixStorage(N, mup, mlp, mup, ark_mem->sunctx);
  if (pdata->savedJ == NULL)
  {
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BP_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* Allocate memory for banded preconditioner. */
  storagemu     = SUNMIN(N - 1, mup + mlp);
  pdata->savedP = NULL;
  pdata->savedP = SUNBandMatrixStorage(N, mup, mlp, storagemu, ark_mem->sunctx);
  if (pdata->savedP == NULL)
  {
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BP_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* Allocate memory for banded linear solver */
  pdata->LS = NULL;
  pdata->LS = SUNLinSol_Band(ark_mem->tempv1, pdata->savedP, ark_mem->sunctx);
  if (pdata->LS == NULL)
  {
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BP_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* allocate memory for temporary N_Vectors */
  pdata->tmp1 = NULL;
  if (!arkAllocVec(ark_mem, ark_mem->tempv1, &(pdata->tmp1)))
  {
    SUNLinSolFree(pdata->LS);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BP_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  pdata->tmp2 = NULL;
  if (!arkAllocVec(ark_mem, ark_mem->tempv1, &(pdata->tmp2)))
  {
    SUNLinSolFree(pdata->LS);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    arkFreeVec(ark_mem, &(pdata->tmp1));
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BP_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* initialize band linear solver object */
  retval = SUNLinSolInitialize(pdata->LS);
  if (retval != SUN_SUCCESS)
  {
    SUNLinSolFree(pdata->LS);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    arkFreeVec(ark_mem, &(pdata->tmp1));
    arkFreeVec(ark_mem, &(pdata->tmp2));
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BP_SUNLS_FAIL);
    return (ARKLS_SUNLS_FAIL);
  }

  /* make sure s_P_data is free from any previous allocations */
  if (arkls_mem->pfree) { arkls_mem->pfree(ark_mem); }

  /* Point to the new P_data field in the LS memory */
  arkls_mem->P_data = pdata;

  /* Attach the pfree function */
  arkls_mem->pfree = ARKBandPrecFree;

  /* Attach preconditioner solve and setup functions */
  retval = ARKodeSetPreconditioner(arkode_mem, ARKBandPrecSetup,
                                   ARKBandPrecSolve);
  return (retval);
}